

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

_Bool golf_level_get_camera_zone
                (golf_level_t *level,vec3 pos,golf_camera_zone_entity_t *camera_zone)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  _Bool _Var12;
  bool bVar13;
  
  uVar9 = (ulong)(level->entities).length;
  if (0 < (long)uVar9) {
    pfVar10 = &(((level->entities).data)->field_4).camera_zone.transform.scale.z;
    _Var12 = true;
    uVar11 = 1;
    do {
      if (pfVar10[-0x1c] == 9.80909e-45) {
        if ((pos.x < pfVar10[-9] + ((vec3 *)(pfVar10 + -2))->x) &&
           (pfVar10[-9] - ((vec3 *)(pfVar10 + -2))->x < pos.x)) {
          if ((pos.z < pfVar10[-7] + *pfVar10) && (pfVar10[-7] - *pfVar10 < pos.z)) {
            uVar1 = *(undefined8 *)(pfVar10 + -10);
            fVar7 = pfVar10[-8];
            fVar8 = pfVar10[-7];
            fVar3 = pfVar10[-6];
            fVar4 = pfVar10[-5];
            fVar5 = pfVar10[-4];
            fVar6 = pfVar10[-3];
            uVar2 = *(undefined8 *)(pfVar10 + -1);
            *(undefined8 *)&(camera_zone->transform).rotation.w = *(undefined8 *)(pfVar10 + -3);
            *(undefined8 *)&(camera_zone->transform).scale.y = uVar2;
            (camera_zone->transform).rotation.x = fVar3;
            (camera_zone->transform).rotation.y = fVar4;
            (camera_zone->transform).rotation.z = fVar5;
            (camera_zone->transform).rotation.w = fVar6;
            camera_zone->towards_hole = (_Bool)(char)uVar1;
            *(int3 *)&camera_zone->field_0x1 = (int3)((ulong)uVar1 >> 8);
            (camera_zone->transform).position.x = (float)(int)((ulong)uVar1 >> 0x20);
            (camera_zone->transform).position.y = fVar7;
            (camera_zone->transform).position.z = fVar8;
            return _Var12;
          }
        }
      }
      _Var12 = uVar11 < uVar9;
      pfVar10 = pfVar10 + 0x144;
      bVar13 = uVar11 != uVar9;
      uVar11 = uVar11 + 1;
    } while (bVar13);
  }
  return false;
}

Assistant:

bool golf_level_get_camera_zone(golf_level_t *level, vec3 pos, golf_camera_zone_entity_t *camera_zone) {
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (entity->type != CAMERA_ZONE_ENTITY) {
            continue;
        }

        vec3 cz_pos = entity->camera_zone.transform.position;
        vec3 cz_scale = entity->camera_zone.transform.scale;
        if (pos.x < cz_pos.x + cz_scale.x && pos.x > cz_pos.x - cz_scale.x &&
                pos.z < cz_pos.z + cz_scale.z && pos.z > cz_pos.z - cz_scale.z) {
            *camera_zone = entity->camera_zone;
            return true;
        }
    }
    return false;
}